

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_00;
  XMLStringPool *pXVar1;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar2;
  SchemaGrammar *this_01;
  Janitor<xercesc_4_0::XercesAttGroupInfo> key;
  ComplexTypeInfo *rootElem;
  uint uVar3;
  int iVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  DOMElement *pDVar7;
  XercesAttGroupInfo *pXVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *pcVar9;
  XercesAttGroupInfo *pXVar10;
  XSAnnotation *pXVar11;
  XMLSize_t XVar12;
  SchemaAttDef *pSVar13;
  SchemaAttDef *pSVar14;
  bool bVar15;
  bool bVar16;
  ulong local_c8;
  XMLSize_t k;
  SchemaAttDef *attGroupWildCard;
  XMLSize_t anyAttCount;
  XercesAttGroupInfo *baseAttGroupInfo;
  uint nameIndex;
  SchemaAttDef *anyAtt;
  XercesAttGroupInfo *saveAttGroupInfo;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  DOMElement *content;
  Janitor<xercesc_4_0::XercesAttGroupInfo> janAttGroupInfo;
  XercesAttGroupInfo *attGroupInfo;
  unsigned_short scope;
  bool refEmpty;
  bool nameEmpty;
  XMLCh *ref;
  XMLCh *name;
  NamespaceScopeManager nsMgr;
  bool topLevel_local;
  ComplexTypeInfo *typeInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo._7_1_ = topLevel;
  typeInfo_local = (ComplexTypeInfo *)elem;
  elem_local = (DOMElement *)this;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&name,elem,this->fSchemaInfo,this);
  pXVar5 = getElementAttValue(this,(DOMElement *)typeInfo_local,(XMLCh *)SchemaSymbols::fgATT_NAME,
                              NCName);
  pXVar6 = getElementAttValue(this,(DOMElement *)typeInfo_local,L"ref",QName);
  bVar15 = true;
  if (pXVar5 != (XMLCh *)0x0) {
    bVar15 = *pXVar5 == L'\0';
  }
  bVar16 = true;
  if (pXVar6 != (XMLCh *)0x0) {
    bVar16 = *pXVar6 == L'\0';
  }
  if ((bVar15) && ((nsMgr.fSchemaInfo._7_1_ & 1) != 0)) {
    reportSchemaError(this,(DOMElement *)typeInfo_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x55,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,(XMLCh *)0x0,(XMLCh *)0x0,
                      (XMLCh *)0x0);
    this_local = (TraverseSchema *)0x0;
    goto LAB_00434971;
  }
  if ((bVar15) && (bVar16)) {
    reportSchemaError(this,(DOMElement *)typeInfo_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x13);
    this_local = (TraverseSchema *)0x0;
    goto LAB_00434971;
  }
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,(DOMElement *)typeInfo_local,nsMgr.fSchemaInfo._7_1_ & 1 ^ 9,
             this,(bool)(nsMgr.fSchemaInfo._7_1_ & 1),this->fNonXSAttList);
  Janitor<xercesc_4_0::XercesAttGroupInfo>::Janitor
            ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content,(XercesAttGroupInfo *)0x0);
  if ((nsMgr.fSchemaInfo._7_1_ & 1) == 0) {
    if (bVar16) {
      this_local = (TraverseSchema *)0x0;
    }
    else {
      janAttGroupInfo.fData =
           processAttributeGroupRef(this,(DOMElement *)typeInfo_local,pXVar6,typeInfo);
LAB_004347e4:
      if (((janAttGroupInfo.fData != (XercesAttGroupInfo *)0x0) &&
          (XVar12 = XercesAttGroupInfo::anyAttributeCount(janAttGroupInfo.fData), XVar12 != 0)) &&
         (pSVar13 = XercesAttGroupInfo::getCompleteWildCard(janAttGroupInfo.fData),
         pSVar13 == (SchemaAttDef *)0x0)) {
        pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        pSVar14 = XercesAttGroupInfo::anyAttributeAt(janAttGroupInfo.fData,0);
        SchemaAttDef::SchemaAttDef(pSVar13,pSVar14);
        for (local_c8 = 1; local_c8 < XVar12; local_c8 = local_c8 + 1) {
          pSVar14 = XercesAttGroupInfo::anyAttributeAt(janAttGroupInfo.fData,local_c8);
          attWildCardIntersection(this,pSVar13,pSVar14);
        }
        XercesAttGroupInfo::setCompleteWildCard(janAttGroupInfo.fData,pSVar13);
      }
      this_local = (TraverseSchema *)janAttGroupInfo.fData;
    }
  }
  else {
    XVar12 = XMLString::stringLen(pXVar5);
    bVar15 = XMLChar1_0::isValidNCName(pXVar5,XVar12);
    rootElem = typeInfo_local;
    if (bVar15) {
      pDVar7 = XUtil::getFirstChildElement((DOMNode *)typeInfo_local);
      janAnnot.fData = (XSAnnotation *)checkContent(this,(DOMElement *)rootElem,pDVar7,true,true);
      bVar15 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
      if (((bVar15) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
         (XVar12 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar12 != 0)) {
        pXVar11 = generateSyntheticAnnotation(this,(DOMElement *)typeInfo_local,this->fNonXSAttList)
        ;
        this->fAnnotation = pXVar11;
      }
      Janitor<xercesc_4_0::XSAnnotation>::Janitor
                ((Janitor<xercesc_4_0::XSAnnotation> *)&saveAttGroupInfo,this->fAnnotation);
      pXVar10 = this->fCurrentAttGroupInfo;
      pXVar8 = (XercesAttGroupInfo *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager);
      uVar3 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fStringPool,pXVar5);
      XercesAttGroupInfo::XercesAttGroupInfo
                (pXVar8,uVar3,this->fTargetNSURI,this->fGrammarPoolMemoryManager);
      Janitor<xercesc_4_0::XercesAttGroupInfo>::reset
                ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content,pXVar8);
      ValueVectorOf<const_xercesc_4_0::DOMElement_*>::addElement
                (this->fDeclStack,(DOMElement **)&typeInfo_local);
      pXVar8 = Janitor<xercesc_4_0::XercesAttGroupInfo>::get
                         ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content);
      this->fCurrentAttGroupInfo = pXVar8;
      for (; janAnnot.fData != (XSAnnotation *)0x0;
          janAnnot.fData = (XSAnnotation *)XUtil::getNextSiblingElement(janAnnot.fData)) {
        iVar4 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
        bVar15 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar4),
                                   (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE);
        if (bVar15) {
          traverseAttributeDecl(this,(DOMElement *)janAnnot.fData,typeInfo,false);
        }
        else {
          iVar4 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
          bVar15 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar4),
                                     (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
          if (!bVar15) break;
          traverseAttributeGroupDecl(this,(DOMElement *)janAnnot.fData,typeInfo,false);
        }
      }
      if (janAnnot.fData != (XSAnnotation *)0x0) {
        iVar4 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
        bVar15 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar4),
                                   (XMLCh *)SchemaSymbols::fgELT_ANYATTRIBUTE);
        if (bVar15) {
          pSVar13 = traverseAnyAttribute(this,(DOMElement *)janAnnot.fData);
          if (pSVar13 != (SchemaAttDef *)0x0) {
            XercesAttGroupInfo::addAnyAttDef(this->fCurrentAttGroupInfo,pSVar13,false);
          }
          pDVar7 = XUtil::getNextSiblingElement((DOMNode *)janAnnot.fData);
          if (pDVar7 != (DOMElement *)0x0) {
            reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,0x65
                              ,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,0x65,
                            pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      this_00 = this->fDeclStack;
      XVar12 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::size(this_00);
      ValueVectorOf<const_xercesc_4_0::DOMElement_*>::removeElementAt(this_00,XVar12 - 1);
      pXVar1 = this->fStringPool;
      pRVar2 = this->fAttGroupRegistry;
      uVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
      pXVar8 = Janitor<xercesc_4_0::XercesAttGroupInfo>::get
                         ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                (pRVar2,(void *)CONCAT44(extraout_var_02,iVar4),pXVar8);
      janAttGroupInfo.fData =
           Janitor<xercesc_4_0::XercesAttGroupInfo>::release
                     ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content);
      this->fCurrentAttGroupInfo = pXVar10;
      XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
      XMLBuffer::append(&this->fBuffer,L',');
      XMLBuffer::append(&this->fBuffer,pXVar5);
      pXVar1 = this->fStringPool;
      pXVar6 = XMLBuffer::getRawBuffer(&this->fBuffer);
      iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar6);
      if ((this->fRedefineComponents !=
           (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) &&
         (pcVar9 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                             (this->fRedefineComponents,SchemaSymbols::fgELT_ATTRIBUTEGROUP,iVar4),
         pcVar9 != (char16_t *)0x0)) {
        XMLBuffer::set(&this->fBuffer,pXVar5);
        XMLBuffer::append(&this->fBuffer,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
        pRVar2 = this->fAttGroupRegistry;
        pXVar5 = XMLBuffer::getRawBuffer(&this->fBuffer);
        pXVar10 = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                            (pRVar2,pXVar5);
        if (pXVar10 != (XercesAttGroupInfo *)0x0) {
          checkAttDerivationOK(this,(DOMElement *)typeInfo_local,pXVar10,janAttGroupInfo.fData);
        }
      }
      bVar15 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull
                         ((Janitor<xercesc_4_0::XSAnnotation> *)&saveAttGroupInfo);
      key = janAttGroupInfo;
      if (!bVar15) {
        this_01 = this->fSchemaGrammar;
        pXVar11 = Janitor<xercesc_4_0::XSAnnotation>::release
                            ((Janitor<xercesc_4_0::XSAnnotation> *)&saveAttGroupInfo);
        SchemaGrammar::putAnnotation(this_01,key.fData,pXVar11);
      }
      Janitor<xercesc_4_0::XSAnnotation>::~Janitor
                ((Janitor<xercesc_4_0::XSAnnotation> *)&saveAttGroupInfo);
      goto LAB_004347e4;
    }
    reportSchemaError(this,(DOMElement *)typeInfo_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                      (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0)
    ;
    this_local = (TraverseSchema *)0x0;
  }
  Janitor<xercesc_4_0::XercesAttGroupInfo>::~Janitor
            ((Janitor<xercesc_4_0::XercesAttGroupInfo> *)&content);
LAB_00434971:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&name);
  return (XercesAttGroupInfo *)this_local;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh* ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool         nameEmpty = (!name || !*name) ? true : false;
    bool         refEmpty = (!ref || !*ref) ? true : false;

    if (nameEmpty && topLevel) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        return 0;
    }

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttGroup);
        return 0;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_AttributeGroupGlobal
                                      : GeneralAttributeCheck::E_AttributeGroupRef;
    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // ------------------------------------------------------------------
    // Handle "ref="
    // ------------------------------------------------------------------
    XercesAttGroupInfo* attGroupInfo;
    Janitor<XercesAttGroupInfo> janAttGroupInfo(0);
    if (!topLevel) {

        if (refEmpty) {
            return 0;
        }

        attGroupInfo = processAttributeGroupRef(elem, ref, typeInfo);
    }
    else
    {
        // name must be a valid NCName
        if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, name);
            return 0;
        }

        // Check for annotations
        DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
        if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
        {
            fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        }
        Janitor<XSAnnotation> janAnnot(fAnnotation);

        // Process contents of global attributeGroups
        XercesAttGroupInfo* saveAttGroupInfo = fCurrentAttGroupInfo;
        janAttGroupInfo.reset(new (fGrammarPoolMemoryManager) XercesAttGroupInfo(
            fStringPool->addOrFind(name), fTargetNSURI, fGrammarPoolMemoryManager));

        fDeclStack->addElement(elem);
        fCurrentAttGroupInfo = janAttGroupInfo.get();

        for (; content !=0; content = XUtil::getNextSiblingElement(content)) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTE)) {
                traverseAttributeDecl(content, typeInfo);
            }
            else if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
                traverseAttributeGroupDecl(content, typeInfo);
            }
            else {
                break;
            }
        }

        if (content != 0) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANYATTRIBUTE)) {

                SchemaAttDef* anyAtt = traverseAnyAttribute(content);

                if (anyAtt) {
                    fCurrentAttGroupInfo->addAnyAttDef(anyAtt);
                }

                if (XUtil::getNextSiblingElement(content) != 0) {
                    reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
                }
            }
            else {
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
            }
        }

        // Pop declaration
        fDeclStack->removeElementAt(fDeclStack->size() - 1);

        fAttGroupRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), janAttGroupInfo.get());
        // Restore old attGroupInfo
        attGroupInfo = janAttGroupInfo.release();
        fCurrentAttGroupInfo = saveAttGroupInfo;

        // Check Attribute Derivation Restriction OK
        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(name);

        unsigned int nameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());

        if (fRedefineComponents && fRedefineComponents->get(SchemaSymbols::fgELT_ATTRIBUTEGROUP, nameIndex)) {

            fBuffer.set(name);
            fBuffer.append(SchemaSymbols::fgRedefIdentifier);
            XercesAttGroupInfo* baseAttGroupInfo = fAttGroupRegistry->get(fBuffer.getRawBuffer());

            if (baseAttGroupInfo)
                checkAttDerivationOK(elem, baseAttGroupInfo, attGroupInfo);
        }

        // Store annotation
        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(attGroupInfo, janAnnot.release());
    }

    // calculate complete wildcard if necessary
    if (attGroupInfo)
    {
        XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();
        if (anyAttCount && !attGroupInfo->getCompleteWildCard())
        {
            SchemaAttDef* attGroupWildCard =  new (fGrammarPoolMemoryManager)
                SchemaAttDef(attGroupInfo->anyAttributeAt(0));

            for (XMLSize_t k= 1; k < anyAttCount; k++)
                attWildCardIntersection(attGroupWildCard, attGroupInfo->anyAttributeAt(k));

            attGroupInfo->setCompleteWildCard(attGroupWildCard);
        }
    }

    return attGroupInfo;
}